

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::append<std::move_iterator<slang::Diagnostic*>,void>
          (SmallVectorBase<slang::Diagnostic> *this,move_iterator<slang::Diagnostic_*> first,
          move_iterator<slang::Diagnostic_*> last)

{
  difference_type dVar1;
  size_type newCapacity;
  iterator __result;
  size_type newSize;
  size_type numElems;
  SmallVectorBase<slang::Diagnostic> *this_local;
  move_iterator<slang::Diagnostic_*> last_local;
  move_iterator<slang::Diagnostic_*> first_local;
  
  dVar1 = std::distance<std::move_iterator<slang::Diagnostic*>>(first,last);
  newCapacity = this->len + dVar1;
  reserve(this,newCapacity);
  __result = end(this);
  std::uninitialized_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
            (first,last,__result);
  this->len = newCapacity;
  return;
}

Assistant:

void append(TIter first, TIter last) {
        auto numElems = static_cast<size_type>(std::distance(first, last));
        auto newSize = len + numElems;
        reserve(newSize);

        std::uninitialized_copy(first, last, end());
        len = newSize;
    }